

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O3

Expression __thiscall
dynet::BidirectionalTreeLSTMBuilder::add_input
          (BidirectionalTreeLSTMBuilder *this,int id,vector<int,_std::allocator<int>_> *children,
          Expression *x)

{
  pointer *ppEVar1;
  uint *puVar2;
  iterator __position;
  vector<int,_std::allocator<int>_> *pvVar3;
  ulong uVar4;
  uint *puVar5;
  Expression EVar6;
  RNNPointer prev;
  Expression embedding;
  RNNPointer local_8c;
  Expression *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  Expression local_78;
  uint local_64;
  initializer_list<dynet::Expression> local_60;
  Expression local_50;
  Expression local_40;
  
  local_8c = -1;
  local_88 = x;
  EVar6 = RNNBuilder::add_input(&(this->fwd_node_builder).super_RNNBuilder,&local_8c,x);
  local_8c = (this->fwd_node_builder).super_RNNBuilder.cur;
  puVar2 = (uint *)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  local_80 = children;
  for (puVar5 = (uint *)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    EVar6 = RNNBuilder::add_input
                      (&(this->fwd_node_builder).super_RNNBuilder,&local_8c,
                       (this->h).
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                       _M_impl.super__Vector_impl_data._M_start + *puVar5);
    local_8c = (this->fwd_node_builder).super_RNNBuilder.cur;
  }
  local_8c = -1;
  local_40 = RNNBuilder::add_input(&(this->rev_node_builder).super_RNNBuilder,&local_8c,local_88);
  pvVar3 = local_80;
  local_8c = (this->rev_node_builder).super_RNNBuilder.cur;
  uVar4 = (ulong)((long)(local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  if ((int)uVar4 != 0) {
    uVar4 = uVar4 & 0xffffffff;
    do {
      local_40 = RNNBuilder::add_input
                           (&(this->rev_node_builder).super_RNNBuilder,&local_8c,
                            (this->h).
                            super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                            (uint)(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start[uVar4 - 1]);
      local_8c = (this->rev_node_builder).super_RNNBuilder.cur;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  local_60._M_array = &local_50;
  local_60._M_len = 2;
  local_64 = 0;
  local_50 = EVar6;
  local_78 = detail::f<dynet::Concatenate,std::initializer_list<dynet::Expression>,unsigned_int>
                       (&local_60,&local_64);
  __position._M_current =
       (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Expression,std::allocator<dynet::Expression>>::
    _M_realloc_insert<dynet::Expression_const&>
              ((vector<dynet::Expression,std::allocator<dynet::Expression>> *)&this->h,__position,
               &local_78);
  }
  else {
    (__position._M_current)->pg = local_78.pg;
    (__position._M_current)->i = local_78.i;
    (__position._M_current)->graph_id = local_78.graph_id;
    ppEVar1 = &(this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return local_78;
}

Assistant:

Expression BidirectionalTreeLSTMBuilder::add_input(int id, vector<int> children, const Expression& x) {
  DYNET_ASSERT(id >= 0 && h.size() == (unsigned)id, "Failed dimension check in TreeLSTMBuilder");

  RNNPointer prev = (RNNPointer)(-1);
  Expression fwd_embedding = fwd_node_builder.add_input(prev, x);
  prev = fwd_node_builder.state();
  for (unsigned child : children) {
    fwd_embedding = fwd_node_builder.add_input(prev, h[child]);
    prev = fwd_node_builder.state();
  }

  prev = (RNNPointer)(-1);
  Expression rev_embedding = rev_node_builder.add_input(prev, x);
  prev = rev_node_builder.state();
  for (unsigned i = children.size(); i-- > 0;) {
    unsigned  child = children[i];
    rev_embedding = rev_node_builder.add_input(prev, h[child]);
    prev = rev_node_builder.state();
  }

  Expression embedding = concatenate({fwd_embedding, rev_embedding});
  h.push_back(embedding);

  return embedding;
}